

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_SetSlopes(void)

{
  line_t_conflict *plVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  
  if (0 < numlines) {
    lVar8 = 0;
    do {
      plVar1 = lines;
      if ((lines[lVar8].special == 0xb5) &&
         (lines[lVar8].special = 0, plVar1[lVar8].backsector != (sector_t_conflict *)0x0)) {
        bVar3 = false;
        lVar6 = 0;
        bVar2 = true;
        do {
          bVar7 = bVar2;
          plVar1 = lines + lVar8;
          uVar5 = plVar1->args[lVar6] & 3;
          if ((bVar3) && (uVar5 == 0)) {
            uVar5 = (uint)lines[lVar8].args[0] >> 2 & 3;
          }
          if (uVar5 == 1) {
            lVar4 = 0x78;
LAB_00451e29:
            P_AlignPlane(*(sector_t_conflict **)((long)plVar1->args + lVar4 + -0x2c),plVar1,
                         (int)lVar6);
          }
          else if (uVar5 == 2) {
            lVar4 = 0x80;
            goto LAB_00451e29;
          }
          lVar6 = 1;
          bVar3 = true;
          bVar2 = false;
        } while (bVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < numlines);
  }
  return;
}

Assistant:

void P_SetSlopes ()
{
	int i, s;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Align)
		{
			lines[i].special = 0;
			if (lines[i].backsector != NULL)
			{
				// args[0] is for floor, args[1] is for ceiling
				//
				// As a special case, if args[1] is 0,
				// then args[0], bits 2-3 are for ceiling.
				for (s = 0; s < 2; s++)
				{
					int bits = lines[i].args[s] & 3;

					if (s == 1 && bits == 0)
						bits = (lines[i].args[0] >> 2) & 3;

					if (bits == 1)			// align front side to back
						P_AlignPlane (lines[i].frontsector, lines + i, s);
					else if (bits == 2)		// align back side to front
						P_AlignPlane (lines[i].backsector, lines + i, s);
				}
			}
		}
	}
}